

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::Tokenizer::NextWithComments
          (Tokenizer *this,string *prev_trailing_comments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments,string *next_leading_comments)

{
  bool bVar1;
  NextCommentStatus NVar2;
  string *psVar3;
  bool result;
  undefined1 local_70 [8];
  CommentCollector collector;
  string *next_leading_comments_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *detached_comments_local;
  string *prev_trailing_comments_local;
  Tokenizer *this_local;
  
  collector._56_8_ = next_leading_comments;
  anon_unknown_3::CommentCollector::CommentCollector
            ((CommentCollector *)local_70,prev_trailing_comments,detached_comments,
             next_leading_comments);
  if ((this->current_).type == TYPE_START) {
    anon_unknown_3::CommentCollector::DetachFromPrev((CommentCollector *)local_70);
    goto switchD_002d8ffd_default;
  }
  ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
  NVar2 = TryConsumeCommentStart(this);
  switch(NVar2) {
  case LINE_COMMENT:
    psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForLineComment_abi_cxx11_
                       ((CommentCollector *)local_70);
    ConsumeLineComment(this,psVar3);
    anon_unknown_3::CommentCollector::Flush((CommentCollector *)local_70);
  default:
switchD_002d8ffd_default:
    do {
      ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
      NVar2 = TryConsumeCommentStart(this);
      switch(NVar2) {
      case LINE_COMMENT:
        psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForLineComment_abi_cxx11_
                           ((CommentCollector *)local_70);
        ConsumeLineComment(this,psVar3);
        break;
      case BLOCK_COMMENT:
        psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForBlockComment_abi_cxx11_
                           ((CommentCollector *)local_70);
        ConsumeBlockComment(this,psVar3);
        ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
        TryConsume(this,'\n');
        break;
      case SLASH_NOT_COMMENT:
        goto switchD_002d8ffd_caseD_2;
      case NO_COMMENT:
        bVar1 = TryConsume(this,'\n');
        if (!bVar1) {
          this_local._7_1_ = Next(this);
          if ((((!this_local._7_1_) || (bVar1 = std::operator==(&(this->current_).text,"}"), bVar1))
              || (bVar1 = std::operator==(&(this->current_).text,"]"), bVar1)) ||
             (bVar1 = std::operator==(&(this->current_).text,")"), bVar1)) {
            anon_unknown_3::CommentCollector::Flush((CommentCollector *)local_70);
          }
          goto LAB_002d9197;
        }
        anon_unknown_3::CommentCollector::Flush((CommentCollector *)local_70);
        anon_unknown_3::CommentCollector::DetachFromPrev((CommentCollector *)local_70);
      }
    } while( true );
  case BLOCK_COMMENT:
    psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForBlockComment_abi_cxx11_
                       ((CommentCollector *)local_70);
    ConsumeBlockComment(this,psVar3);
    ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
    bVar1 = TryConsume(this,'\n');
    if (bVar1) {
      anon_unknown_3::CommentCollector::Flush((CommentCollector *)local_70);
      goto switchD_002d8ffd_default;
    }
    anon_unknown_3::CommentCollector::ClearBuffer((CommentCollector *)local_70);
    this_local._7_1_ = Next(this);
    break;
  case SLASH_NOT_COMMENT:
    this_local._7_1_ = true;
    break;
  case NO_COMMENT:
    bVar1 = TryConsume(this,'\n');
    if (bVar1) goto switchD_002d8ffd_default;
    this_local._7_1_ = Next(this);
  }
LAB_002d9197:
  anon_unknown_3::CommentCollector::~CommentCollector((CommentCollector *)local_70);
  return this_local._7_1_;
switchD_002d8ffd_caseD_2:
  this_local._7_1_ = true;
  goto LAB_002d9197;
}

Assistant:

bool Tokenizer::NextWithComments(string* prev_trailing_comments,
                                 vector<string>* detached_comments,
                                 string* next_leading_comments) {
  CommentCollector collector(prev_trailing_comments, detached_comments,
                             next_leading_comments);

  if (current_.type == TYPE_START) {
    collector.DetachFromPrev();
  } else {
    // A comment appearing on the same line must be attached to the previous
    // declaration.
    ConsumeZeroOrMore<WhitespaceNoNewline>();
    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        ConsumeZeroOrMore<WhitespaceNoNewline>();
        if (!TryConsume('\n')) {
          // Oops, the next token is on the same line.  If we recorded a comment
          // we really have no idea which token it should be attached to.
          collector.ClearBuffer();
          return Next();
        }

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (!TryConsume('\n')) {
          // The next token is on the same line.  There are no comments.
          return Next();
        }
        break;
    }
  }

  // OK, we are now on the line *after* the previous token.
  while (true) {
    ConsumeZeroOrMore<WhitespaceNoNewline>();

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        // Consume the rest of the line so that we don't interpret it as a
        // blank line the next time around the loop.
        ConsumeZeroOrMore<WhitespaceNoNewline>();
        TryConsume('\n');
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (TryConsume('\n')) {
          // Completely blank line.
          collector.Flush();
          collector.DetachFromPrev();
        } else {
          bool result = Next();
          if (!result ||
              current_.text == "}" ||
              current_.text == "]" ||
              current_.text == ")") {
            // It looks like we're at the end of a scope.  In this case it
            // makes no sense to attach a comment to the following token.
            collector.Flush();
          }
          return result;
        }
        break;
    }
  }
}